

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaUtilityTargetGenerator.cxx
# Opt level: O1

void __thiscall cmNinjaUtilityTargetGenerator::Generate(cmNinjaUtilityTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmCustomCommand *pcVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar7;
  cmGeneratorTarget *this_01;
  pointer ppcVar8;
  bool bVar9;
  TargetType TVar10;
  string *psVar11;
  long *plVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  MapToNinjaPathImpl MVar14;
  long lVar15;
  cmCustomCommand *pcVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar17;
  char *__s;
  cmGlobalNinjaGenerator *pcVar18;
  cmGeneratedFileStream *pcVar19;
  size_type *psVar20;
  bool bVar21;
  pointer ppcVar22;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  string *util_output;
  allocator_type local_2a9;
  cmCustomCommandGenerator ccg;
  string local_218;
  string command;
  string desc;
  string config;
  undefined1 local_188 [32];
  string utilCommandName;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  cmNinjaDeps deps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  cmNinjaDeps outputs;
  cmNinjaDeps util_outputs;
  string local_b8;
  string local_98;
  cmNinjaDeps local_78;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [2];
  cmNinjaDeps local_48;
  
  psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                      ((cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
  utilCommandName._M_dataplus._M_p = (pointer)&utilCommandName.field_2;
  pcVar3 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&utilCommandName,pcVar3,pcVar3 + psVar11->_M_string_length);
  std::__cxx11::string::append((char *)&utilCommandName);
  std::__cxx11::string::append((char *)&utilCommandName);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&config,&this->super_cmNinjaTargetGenerator);
  plVar12 = (long *)std::__cxx11::string::append((char *)&config);
  ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
  pcVar16 = (cmCustomCommand *)(plVar12 + 2);
  if ((cmCustomCommand *)*plVar12 == pcVar16) {
    ccg.Config._M_string_length =
         (size_type)
         (pcVar16->Outputs).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ccg.Config.field_2._M_allocated_capacity = plVar12[3];
  }
  else {
    ccg.Config._M_string_length =
         (size_type)
         (pcVar16->Outputs).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ccg.CC = (cmCustomCommand *)*plVar12;
  }
  ccg.Config._M_dataplus._M_p = (pointer)plVar12[1];
  *plVar12 = (long)pcVar16;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&utilCommandName,(ulong)ccg.CC);
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)config._M_dataplus._M_p != &config.field_2) {
    operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
  }
  cmNinjaTargetGenerator::ConvertToNinjaPath
            ((string *)&ccg,&this->super_cmNinjaTargetGenerator,&utilCommandName);
  std::__cxx11::string::operator=((string *)&utilCommandName,(string *)&ccg);
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&util_outputs,1,&utilCommandName,(allocator_type *)&ccg);
  cmdLists[0] = cmGeneratorTarget::GetPreBuildCommands
                          ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget);
  cmdLists[1] = cmGeneratorTarget::GetPostBuildCommands
                          ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget);
  lVar15 = 0;
  bVar21 = false;
  bVar9 = false;
  do {
    pcVar4 = (cmdLists[lVar15]->
             super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar16 = (cmdLists[lVar15]->
                   super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
                   super__Vector_impl_data._M_start; pcVar16 != pcVar4; pcVar16 = pcVar16 + 1) {
      psVar11 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar3 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar3,pcVar3 + psVar11->_M_string_length);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&ccg,pcVar16,&local_98,
                 (cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      cmLocalNinjaGenerator::AppendCustomCommandDeps
                ((this->super_cmNinjaTargetGenerator).LocalGenerator,&ccg,&deps);
      cmLocalNinjaGenerator::AppendCustomCommandLines
                ((this->super_cmNinjaTargetGenerator).LocalGenerator,&ccg,&commands);
      pvVar13 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
      _Var5._M_current =
           (pvVar13->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var6._M_current =
           (pvVar13->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      MVar14.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                (_Var5,_Var6,&util_outputs,MVar14);
      bVar9 = cmCustomCommand::GetUsesTerminal(pcVar16);
      if (bVar9) {
        bVar21 = true;
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
      bVar9 = bVar21;
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 2);
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ccg,"CMAKE_BUILD_TYPE","");
  psVar11 = cmMakefile::GetSafeDefinition(this_00,(string *)&ccg);
  config._M_dataplus._M_p = (pointer)&config.field_2;
  pcVar3 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&config,pcVar3,pcVar3 + psVar11->_M_string_length);
  if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
    operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
  }
  cmGeneratorTarget::GetSourceFiles
            ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &sources,&config);
  ppcVar8 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar22 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pcVar16 = cmSourceFile::GetCustomCommand(*ppcVar22);
      if (pcVar16 != (cmCustomCommand *)0x0) {
        psVar11 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this)
        ;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        pcVar3 = (psVar11->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar3,pcVar3 + psVar11->_M_string_length);
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  (&ccg,pcVar16,&local_b8,
                   (cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        cmLocalNinjaGenerator::AddCustomCommandTarget
                  ((this->super_cmNinjaTargetGenerator).LocalGenerator,pcVar16,
                   (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                   GeneratorTarget);
        pvVar13 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(&ccg);
        pvVar17 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(&ccg);
        _Var5._M_current =
             (pvVar13->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_current =
             (pvVar13->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        MVar14.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (_Var5,_Var6,&deps,MVar14);
        _Var5._M_current =
             (pvVar17->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_current =
             (pvVar17->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        MVar14.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (_Var5,_Var6,&deps,MVar14);
        cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
      }
      ppcVar22 = ppcVar22 + 1;
    } while (ppcVar22 != ppcVar8);
  }
  cmLocalNinjaGenerator::AppendTargetOutputs
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &outputs);
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &deps,DependOnTargetArtifact);
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar18 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar19 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&desc,&this->super_cmNinjaTargetGenerator);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&desc,0,(char *)0x0,0x4ce82c);
    psVar20 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar20) {
      command.field_2._M_allocated_capacity = *psVar20;
      command.field_2._8_8_ = plVar12[3];
      command._M_dataplus._M_p = (pointer)&command.field_2;
    }
    else {
      command.field_2._M_allocated_capacity = *psVar20;
      command._M_dataplus._M_p = (pointer)*plVar12;
    }
    command._M_string_length = plVar12[1];
    *plVar12 = (long)psVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    local_218.field_2._M_allocated_capacity = 0;
    local_218._M_dataplus._M_p = (pointer)0x0;
    local_218._M_string_length = 0;
    local_188._16_8_ = (pointer)0x0;
    local_188._0_8_ = (pointer)0x0;
    local_188._8_8_ = (pointer)0x0;
    ccg.Config.field_2._M_allocated_capacity = (size_type)&ccg.Config;
    ccg.Config._M_string_length = 0;
    ccg.CC = (cmCustomCommand *)0x0;
    ccg.Config._M_dataplus._M_p = (pointer)0x0;
    ccg.LG = (cmLocalGenerator *)0x0;
    ccg.Config.field_2._8_8_ = ccg.Config.field_2._M_allocated_capacity;
    cmGlobalNinjaGenerator::WritePhonyBuild
              (pcVar18,(ostream *)pcVar19,&command,&outputs,&deps,(cmNinjaDeps *)&local_218,
               (cmNinjaDeps *)local_188,(cmNinjaVars *)&ccg);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&ccg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)command._M_dataplus._M_p != &command.field_2) {
      operator_delete(command._M_dataplus._M_p,command.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)desc._M_dataplus._M_p != &desc.field_2) {
      uVar23 = CONCAT71(desc.field_2._M_allocated_capacity._1_7_,desc.field_2._M_local_buf[0]);
      _Var24._M_p = desc._M_dataplus._M_p;
LAB_0028c03d:
      operator_delete(_Var24._M_p,uVar23 + 1);
    }
LAB_0028c045:
    TVar10 = cmGeneratorTarget::GetType
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    if (TVar10 == GLOBAL_TARGET) goto LAB_0028c098;
    pcVar18 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)&ccg,&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddTargetAlias
              (pcVar18,(string *)&ccg,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
    uVar23 = ccg.Config._M_string_length;
    _Var24._M_p = (pointer)ccg.CC;
    if (ccg.CC == (cmCustomCommand *)&ccg.Config._M_string_length) goto LAB_0028c098;
  }
  else {
    pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ccg,"utility","");
    cmLocalNinjaGenerator::BuildCommandLine
              (&command,pcVar7,&commands,(string *)&ccg,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
    if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ccg,"EchoString","");
    __s = cmGeneratorTarget::GetProperty(this_01,(string *)&ccg);
    if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    paVar1 = &desc.field_2;
    desc._M_string_length = 0;
    desc.field_2._M_local_buf[0] = '\0';
    desc._M_dataplus._M_p = (pointer)paVar1;
    if (__s == (char *)0x0) {
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_218,&this->super_cmNinjaTargetGenerator);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x4ce854);
      psVar20 = &ccg.Config._M_string_length;
      pcVar16 = (cmCustomCommand *)(plVar12 + 2);
      if ((cmCustomCommand *)*plVar12 == pcVar16) {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar16->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.Config.field_2._M_allocated_capacity = plVar12[3];
        ccg.CC = (cmCustomCommand *)psVar20;
      }
      else {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar16->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.CC = (cmCustomCommand *)*plVar12;
      }
      ccg.Config._M_dataplus._M_p = (pointer)plVar12[1];
      *plVar12 = (long)pcVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&desc,(string *)&ccg);
      if (ccg.CC != (cmCustomCommand *)psVar20) {
        operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&desc,0,(char *)0x0,(ulong)__s);
    }
    pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar11 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar7);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&ccg,
               &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar11,SHELL);
    cmsys::SystemTools::ReplaceString(&command,"$(CMAKE_SOURCE_DIR)",(char *)ccg.CC);
    if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    pcVar7 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar7);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&ccg,
               &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar11,SHELL);
    cmsys::SystemTools::ReplaceString(&command,"$(CMAKE_BINARY_DIR)",(char *)ccg.CC);
    if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
      operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
    }
    cmsys::SystemTools::ReplaceString(&command,"$(ARGS)","");
    lVar15 = std::__cxx11::string::find((char)&command,0x24);
    if (lVar15 == -1) {
      for (; util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             util_outputs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          util_outputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               util_outputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        pcVar18 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::SeenCustomCommandOutput
                  (pcVar18,util_outputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar18 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_218,&this->super_cmNinjaTargetGenerator);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x4ce82c);
      ccg.CC = (cmCustomCommand *)&ccg.Config._M_string_length;
      pcVar16 = (cmCustomCommand *)(plVar12 + 2);
      if ((cmCustomCommand *)*plVar12 == pcVar16) {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar16->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.Config.field_2._M_allocated_capacity = plVar12[3];
      }
      else {
        ccg.Config._M_string_length =
             (size_type)
             (pcVar16->Outputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ccg.CC = (cmCustomCommand *)*plVar12;
      }
      ccg.Config._M_dataplus._M_p = (pointer)plVar12[1];
      *plVar12 = (long)pcVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_188._0_8_ = (pointer)(local_188 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"");
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGlobalNinjaGenerator::WriteCustomCommandBuild
                (pcVar18,&command,&desc,(string *)&ccg,(string *)local_188,bVar9,true,&util_outputs,
                 &deps,&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
      }
      if (ccg.CC != (cmCustomCommand *)&ccg.Config._M_string_length) {
        operator_delete(ccg.CC,ccg.Config._M_string_length + 1);
      }
      paVar2 = &local_218.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      pcVar18 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar19 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      local_218._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_188,1,&utilCommandName,&local_2a9);
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ccg.Config.field_2._M_allocated_capacity = (size_type)&ccg.Config;
      ccg.Config._M_string_length = 0;
      ccg.CC = (cmCustomCommand *)0x0;
      ccg.Config._M_dataplus._M_p = (pointer)0x0;
      ccg.LG = (cmLocalGenerator *)0x0;
      ccg.Config.field_2._8_8_ = ccg.Config.field_2._M_allocated_capacity;
      cmGlobalNinjaGenerator::WritePhonyBuild
                (pcVar18,(ostream *)pcVar19,&local_218,&outputs,(cmNinjaDeps *)local_188,&local_78,
                 &local_48,(cmNinjaVars *)&ccg);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&ccg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)desc._M_dataplus._M_p != paVar1) {
        operator_delete(desc._M_dataplus._M_p,
                        CONCAT71(desc.field_2._M_allocated_capacity._1_7_,
                                 desc.field_2._M_local_buf[0]) + 1);
      }
      uVar23 = command.field_2._M_allocated_capacity;
      _Var24._M_p = command._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)command._M_dataplus._M_p != &command.field_2) goto LAB_0028c03d;
      goto LAB_0028c045;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)desc._M_dataplus._M_p != paVar1) {
      operator_delete(desc._M_dataplus._M_p,
                      CONCAT71(desc.field_2._M_allocated_capacity._1_7_,desc.field_2._M_local_buf[0]
                              ) + 1);
    }
    uVar23 = command.field_2._M_allocated_capacity;
    _Var24._M_p = command._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)command._M_dataplus._M_p == &command.field_2) goto LAB_0028c098;
  }
  operator_delete(_Var24._M_p,uVar23 + 1);
LAB_0028c098:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)config._M_dataplus._M_p != &config.field_2) {
    operator_delete(config._M_dataplus._M_p,config.field_2._M_allocated_capacity + 1);
  }
  if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&util_outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&deps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)utilCommandName._M_dataplus._M_p != &utilCommandName.field_2) {
    operator_delete(utilCommandName._M_dataplus._M_p,
                    utilCommandName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaUtilityTargetGenerator::Generate()
{
  std::string utilCommandName =
    this->GetLocalGenerator()->GetCurrentBinaryDirectory();
  utilCommandName += "/CMakeFiles";
  utilCommandName += "/";
  utilCommandName += this->GetTargetName() + ".util";
  utilCommandName = this->ConvertToNinjaPath(utilCommandName);

  std::vector<std::string> commands;
  cmNinjaDeps deps, outputs, util_outputs(1, utilCommandName);

  const std::vector<cmCustomCommand>* cmdLists[2] = {
    &this->GetGeneratorTarget()->GetPreBuildCommands(),
    &this->GetGeneratorTarget()->GetPostBuildCommands()
  };

  bool uses_terminal = false;

  for (unsigned i = 0; i != 2; ++i) {
    for (cmCustomCommand const& ci : *cmdLists[i]) {
      cmCustomCommandGenerator ccg(ci, this->GetConfigName(),
                                   this->GetLocalGenerator());
      this->GetLocalGenerator()->AppendCustomCommandDeps(ccg, deps);
      this->GetLocalGenerator()->AppendCustomCommandLines(ccg, commands);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(util_outputs), MapToNinjaPath());
      if (ci.GetUsesTerminal()) {
        uses_terminal = true;
      }
    }
  }

  std::vector<cmSourceFile*> sources;
  std::string config =
    this->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");
  this->GetGeneratorTarget()->GetSourceFiles(sources, config);
  for (cmSourceFile const* source : sources) {
    if (cmCustomCommand const* cc = source->GetCustomCommand()) {
      cmCustomCommandGenerator ccg(*cc, this->GetConfigName(),
                                   this->GetLocalGenerator());
      this->GetLocalGenerator()->AddCustomCommandTarget(
        cc, this->GetGeneratorTarget());

      // Depend on all custom command outputs.
      const std::vector<std::string>& ccOutputs = ccg.GetOutputs();
      const std::vector<std::string>& ccByproducts = ccg.GetByproducts();
      std::transform(ccOutputs.begin(), ccOutputs.end(),
                     std::back_inserter(deps), MapToNinjaPath());
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(deps), MapToNinjaPath());
    }
  }

  this->GetLocalGenerator()->AppendTargetOutputs(this->GetGeneratorTarget(),
                                                 outputs);
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 deps);

  if (commands.empty()) {
    this->GetGlobalGenerator()->WritePhonyBuild(
      this->GetBuildFileStream(),
      "Utility command for " + this->GetTargetName(), outputs, deps);
  } else {
    std::string command = this->GetLocalGenerator()->BuildCommandLine(
      commands, "utility", this->GeneratorTarget);
    const char* echoStr =
      this->GetGeneratorTarget()->GetProperty("EchoString");
    std::string desc;
    if (echoStr) {
      desc = echoStr;
    } else {
      desc = "Running utility command for " + this->GetTargetName();
    }

    // TODO: fix problematic global targets.  For now, search and replace the
    // makefile vars.
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_SOURCE_DIR)",
      this->GetLocalGenerator()
        ->ConvertToOutputFormat(
          this->GetLocalGenerator()->GetSourceDirectory(),
          cmOutputConverter::SHELL)
        .c_str());
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_BINARY_DIR)",
      this->GetLocalGenerator()
        ->ConvertToOutputFormat(
          this->GetLocalGenerator()->GetBinaryDirectory(),
          cmOutputConverter::SHELL)
        .c_str());
    cmSystemTools::ReplaceString(command, "$(ARGS)", "");

    if (command.find('$') != std::string::npos) {
      return;
    }

    for (std::string const& util_output : util_outputs) {
      this->GetGlobalGenerator()->SeenCustomCommandOutput(util_output);
    }

    this->GetGlobalGenerator()->WriteCustomCommandBuild(
      command, desc, "Utility command for " + this->GetTargetName(),
      /*depfile*/ "", uses_terminal,
      /*restat*/ true, util_outputs, deps);

    this->GetGlobalGenerator()->WritePhonyBuild(
      this->GetBuildFileStream(), "", outputs,
      cmNinjaDeps(1, utilCommandName));
  }

  // Add an alias for the logical target name regardless of what directory
  // contains it.  Skip this for GLOBAL_TARGET because they are meant to
  // be per-directory and have one at the top-level anyway.
  if (this->GetGeneratorTarget()->GetType() != cmStateEnums::GLOBAL_TARGET) {
    this->GetGlobalGenerator()->AddTargetAlias(this->GetTargetName(),
                                               this->GetGeneratorTarget());
  }
}